

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O3

response * __thiscall
warhawk::common::webclient::execute(response *__return_storage_ptr__,webclient *this,request *req_)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  void *pvVar3;
  char *__s;
  undefined8 *puVar4;
  response *prVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  _Base_ptr p_Var9;
  size_t sVar10;
  runtime_error *this_00;
  size_type *psVar11;
  webclient *pwVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  curl_slist *info;
  response *resp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_f8;
  webclient *local_d8;
  undefined8 *local_d0;
  response *local_c8;
  cookie local_c0;
  
  p_Var9 = (req_->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(req_->m_headers)._M_t._M_impl.super__Rb_tree_header;
  local_d8 = this;
  local_c8 = __return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
    lVar8 = 0;
  }
  else {
    paVar2 = &local_c0.m_domain.field_2;
    lVar8 = 0;
    do {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,*(long *)(p_Var9 + 1),
                 (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
      std::__cxx11::string::append((char *)&local_f8);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,*(ulong *)(p_Var9 + 2));
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_c0.m_domain.field_2._M_allocated_capacity = *psVar11;
        local_c0.m_domain.field_2._8_8_ = plVar7[3];
        local_c0.m_domain._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_c0.m_domain.field_2._M_allocated_capacity = *psVar11;
        local_c0.m_domain._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_c0.m_domain._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      lVar8 = curl_slist_append(lVar8,local_c0.m_domain._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_domain._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0.m_domain._M_dataplus._M_p,
                        local_c0.m_domain.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  pwVar12 = local_d8;
  curl_easy_setopt(local_d8->m_curl,0x2727,lVar8);
  p_Var9 = (req_->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(req_->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      pvVar3 = pwVar12->m_curl;
      cookie::to_string_abi_cxx11_(&local_c0.m_domain,(cookie *)(p_Var9 + 1));
      curl_easy_setopt(pvVar3,0x2797,local_c0.m_domain._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_domain._M_dataplus._M_p != &local_c0.m_domain.field_2) {
        operator_delete(local_c0.m_domain._M_dataplus._M_p,
                        local_c0.m_domain.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      pwVar12 = local_d8;
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  if ((req_->m_method)._M_string_length != 0) {
    curl_easy_setopt(pwVar12->m_curl,0x2734,(req_->m_method)._M_dataplus._M_p);
  }
  prVar5 = local_c8;
  if ((req_->m_data)._M_string_length != 0) {
    curl_easy_setopt(pwVar12->m_curl,0x3c);
    curl_easy_setopt(pwVar12->m_curl,0x271f,(req_->m_data)._M_dataplus._M_p);
  }
  curl_easy_setopt(pwVar12->m_curl,0x2712,(req_->m_url)._M_dataplus._M_p);
  curl_easy_setopt(pwVar12->m_curl,0x34,req_->m_follow_redirect);
  (prVar5->m_data)._M_dataplus._M_p = (pointer)&(prVar5->m_data).field_2;
  (prVar5->m_data)._M_string_length = 0;
  (prVar5->m_data).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(prVar5->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header;
  (prVar5->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (prVar5->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (prVar5->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (prVar5->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (prVar5->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(prVar5->m_headers)._M_t._M_impl.super__Rb_tree_header;
  (prVar5->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (prVar5->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (prVar5->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (prVar5->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (prVar5->m_headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  curl_easy_setopt(pwVar12->m_curl,0x4e2b,string_write_cb);
  curl_easy_setopt(pwVar12->m_curl,0x2711,prVar5);
  curl_easy_setopt(pwVar12->m_curl,0x4e6f,multimap_header_cb);
  curl_easy_setopt(pwVar12->m_curl,0x272d,&prVar5->m_headers);
  iVar6 = curl_easy_perform(pwVar12->m_curl);
  if (lVar8 != 0) {
    curl_slist_free_all(lVar8);
  }
  if (iVar6 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Failed to execute curl request:","");
    curl_easy_strerror(iVar6);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_c0.m_domain._M_dataplus._M_p = (pointer)*plVar7;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_c0.m_domain._M_dataplus._M_p == psVar11) {
      local_c0.m_domain.field_2._M_allocated_capacity = *psVar11;
      local_c0.m_domain.field_2._8_8_ = plVar7[3];
      local_c0.m_domain._M_dataplus._M_p = (pointer)&local_c0.m_domain.field_2;
    }
    else {
      local_c0.m_domain.field_2._M_allocated_capacity = *psVar11;
    }
    local_c0.m_domain._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_c0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  curl_easy_getinfo(pwVar12->m_curl,0x40001c,&local_d0);
  puVar4 = local_d0;
  if (local_d0 != (undefined8 *)0x0) {
    do {
      __s = (char *)*local_d0;
      if (__s != (char *)0x0) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        sVar10 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,__s,__s + sVar10);
        cookie::parse(&local_c0,&local_f8);
        std::
        _Rb_tree<warhawk::common::cookie,_warhawk::common::cookie,_std::_Identity<warhawk::common::cookie>,_std::less<warhawk::common::cookie>,_std::allocator<warhawk::common::cookie>_>
        ::_M_insert_unique<warhawk::common::cookie>
                  ((_Rb_tree<warhawk::common::cookie,_warhawk::common::cookie,_std::_Identity<warhawk::common::cookie>,_std::less<warhawk::common::cookie>,_std::allocator<warhawk::common::cookie>_>
                    *)&prVar5->m_cookies,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_value._M_dataplus._M_p != &local_c0.m_value.field_2) {
          operator_delete(local_c0.m_value._M_dataplus._M_p,
                          local_c0.m_value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
          operator_delete(local_c0.m_name._M_dataplus._M_p,
                          local_c0.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_path._M_dataplus._M_p != &local_c0.m_path.field_2) {
          operator_delete(local_c0.m_path._M_dataplus._M_p,
                          local_c0.m_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_domain._M_dataplus._M_p != &local_c0.m_domain.field_2) {
          operator_delete(local_c0.m_domain._M_dataplus._M_p,
                          local_c0.m_domain.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      local_d0 = (undefined8 *)local_d0[1];
    } while (local_d0 != (undefined8 *)0x0);
  }
  curl_easy_getinfo(local_d8->m_curl,0x200002,&prVar5->m_status_code);
  if (puVar4 != (undefined8 *)0x0) {
    curl_slist_free_all();
  }
  return prVar5;
}

Assistant:

response webclient::execute( const request &req_ )
{
  struct curl_slist* headers = nullptr;

  for ( auto &e : req_.m_headers )
  {
    auto str = e.first + ":" + e.second;
    headers = curl_slist_append( headers, str.c_str( ) );
  }

  curl_easy_setopt( m_curl, CURLOPT_HTTPHEADER, headers );

  for ( auto &c : req_.m_cookies.m_cookies )
  {
    curl_easy_setopt( m_curl, CURLOPT_COOKIELIST, c.to_string( ).c_str( ) );
  }

  if ( !req_.m_method.empty( ) )
  {
    curl_easy_setopt( m_curl, CURLOPT_CUSTOMREQUEST, req_.m_method.c_str( ) );
  }

  if ( !req_.m_data.empty( ) )
  {
    curl_easy_setopt( m_curl, CURLOPT_POSTFIELDSIZE, req_.m_data.size( ) );
    curl_easy_setopt( m_curl, CURLOPT_POSTFIELDS,    req_.m_data.data( ) );
  }

  curl_easy_setopt( m_curl, CURLOPT_URL,            req_.m_url.c_str( )            );
  curl_easy_setopt( m_curl, CURLOPT_FOLLOWLOCATION, req_.m_follow_redirect ? 1 : 0 );

  response resp;

  curl_easy_setopt( m_curl, CURLOPT_WRITEFUNCTION,  string_write_cb    );
  curl_easy_setopt( m_curl, CURLOPT_WRITEDATA,     &resp.m_data        );
  curl_easy_setopt( m_curl, CURLOPT_HEADERFUNCTION, multimap_header_cb );
  curl_easy_setopt( m_curl, CURLOPT_HEADERDATA,    &resp.m_headers     );

  auto res = curl_easy_perform( m_curl );

  if ( headers != NULL )
  {
    curl_slist_free_all( headers );
  }

  if ( res == CURLE_OK )
  {
    struct curl_slist *info;
    res = curl_easy_getinfo( m_curl, CURLINFO_COOKIELIST, &info );
    std::unique_ptr< struct curl_slist, decltype( &curl_slist_free_all ) > cleanup( info, &curl_slist_free_all );

    while ( info != nullptr )
    {
      if ( info->data != nullptr )
      {
        resp.m_cookies.m_cookies.insert( cookie::parse( info->data ) );
      }

      info = info->next;
    }

    curl_easy_getinfo( m_curl, CURLINFO_RESPONSE_CODE, &resp.m_status_code );

    return resp;
  }
  else
  {
    throw std::runtime_error( std::string( "Failed to execute curl request:" ) + curl_easy_strerror( res ) );
  }
}